

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

int __thiscall CPU::instrDEC0xce(CPU *this)

{
  Memory *this_00;
  uint8_t uVar1;
  uint16_t uVar2;
  byte bVar3;
  
  uVar2 = this->PC;
  this->PC = uVar2 + 2;
  uVar2 = Memory::Read16(this->m,uVar2);
  this_00 = this->m;
  uVar1 = Memory::Read8(this_00,uVar2);
  uVar1 = uVar1 + 0xff;
  if (uVar1 == '\0') {
    bVar3 = this->field_0x2e | 0x40;
  }
  else {
    bVar3 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar3 = bVar3 | 1;
      goto LAB_0010f00b;
    }
  }
  bVar3 = bVar3 & 0xfe;
LAB_0010f00b:
  this->field_0x2e = bVar3;
  Memory::Write8(this_00,uVar2,uVar1);
  return 6;
}

Assistant:

int CPU::instrDEC0xce() {
	uint16_t address = absolute_addr_j();
	m->Write8(address, DEC(m->Read8(address)));
	return 6;
}